

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O0

int read_header_tga(gdIOCtx *ctx,oTga *tga)

{
  int iVar1;
  char *pcVar2;
  byte local_38;
  uint8_t local_37;
  uint8_t local_36;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  uint8_t local_31;
  uchar header [18];
  oTga *tga_local;
  gdIOCtx *ctx_local;
  
  unique0x100001dd = tga;
  iVar1 = gdGetBuf(&local_38,0x12,ctx);
  if (iVar1 < 0x12) {
    gd_error("fail to read header");
    ctx_local._4_4_ = -1;
  }
  else {
    stack0xffffffffffffffe0->identsize = local_38;
    stack0xffffffffffffffe0->colormaptype = local_37;
    stack0xffffffffffffffe0->imagetype = local_36;
    stack0xffffffffffffffe0->colormapstart = (uint)local_35 + (uint)local_34 * 0x100;
    stack0xffffffffffffffe0->colormaplength = (uint)local_33 + (uint)local_32 * 0x100;
    stack0xffffffffffffffe0->colormapbits = local_31;
    stack0xffffffffffffffe0->xstart = (uint)header[0] + (uint)header[1] * 0x100;
    stack0xffffffffffffffe0->ystart = (uint)header[2] + (uint)header[3] * 0x100;
    stack0xffffffffffffffe0->width = (uint)header[4] + (uint)header[5] * 0x100;
    stack0xffffffffffffffe0->height = (uint)header[6] + (uint)header[7] * 0x100;
    stack0xffffffffffffffe0->bits = header[8];
    stack0xffffffffffffffe0->alphabits = header[9] & 0xf;
    stack0xffffffffffffffe0->fliph = (header[9] & 0x10) != 0;
    stack0xffffffffffffffe0->flipv = (header[9] & 0x20) == 0;
    if (((stack0xffffffffffffffe0->bits == '\x18') && (stack0xffffffffffffffe0->alphabits == '\0'))
       || ((stack0xffffffffffffffe0->bits == ' ' && (stack0xffffffffffffffe0->alphabits == '\b'))))
    {
      stack0xffffffffffffffe0->ident = (char *)0x0;
      if (stack0xffffffffffffffe0->identsize != '\0') {
        pcVar2 = (char *)gdMalloc((ulong)stack0xffffffffffffffe0->identsize);
        stack0xffffffffffffffe0->ident = pcVar2;
        if (stack0xffffffffffffffe0->ident == (char *)0x0) {
          return -1;
        }
        gdGetBuf(stack0xffffffffffffffe0->ident,(uint)stack0xffffffffffffffe0->identsize,ctx);
      }
      ctx_local._4_4_ = 1;
    }
    else {
      gd_error_ex(4,"gd-tga: %u bits per pixel with %u alpha bits not supported\n",
                  (ulong)stack0xffffffffffffffe0->bits,(ulong)stack0xffffffffffffffe0->alphabits);
      ctx_local._4_4_ = -1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int read_header_tga(gdIOCtx *ctx, oTga *tga)
{

	unsigned char header[18];

	if (gdGetBuf(header, sizeof(header), ctx) < 18) {
		gd_error("fail to read header");
		return -1;
	}

	tga->identsize = header[0];
	tga->colormaptype = header[1];
	tga->imagetype = header[2];
	tga->colormapstart = header[3] + (header[4] << 8);
	tga->colormaplength = header[5] + (header[6] << 8);
	tga->colormapbits = header[7];
	tga->xstart = header[8] + (header[9] << 8);
	tga->ystart = header[10] + (header[11] << 8);
	tga->width = header[12] + (header[13] << 8);
	tga->height = header[14] + (header[15] << 8);
	tga->bits = header[16];
	tga->alphabits = header[17] & 0x0f;
	tga->fliph = (header[17] & 0x10) ? 1 : 0;
	tga->flipv = (header[17] & 0x20) ? 0 : 1;

#if DEBUG
	printf("format bps: %i\n", tga->bits);
	printf("flip h/v: %i / %i\n", tga->fliph, tga->flipv);
	printf("alpha: %i\n", tga->alphabits);
	printf("wxh: %i %i\n", tga->width, tga->height);
#endif

	if (!((tga->bits == TGA_BPP_24 && tga->alphabits == 0)
		|| (tga->bits == TGA_BPP_32 && tga->alphabits == 8)))
	{
		gd_error_ex(GD_WARNING, "gd-tga: %u bits per pixel with %u alpha bits not supported\n",
			tga->bits, tga->alphabits);
		return -1;
	}

	tga->ident = NULL;

	if (tga->identsize > 0) {
		tga->ident = (char *) gdMalloc(tga->identsize * sizeof(char));
		if(tga->ident == NULL) {
			return -1;
		}

		gdGetBuf(tga->ident, tga->identsize, ctx);
	}

	return 1;
}